

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

ParseableFunctionInfo * __thiscall
Js::ParseableFunctionInfo::GetNestedFunctionForExecution(ParseableFunctionInfo *this,uint index)

{
  code *pcVar1;
  bool bVar2;
  FunctionInfo *this_00;
  undefined4 *puVar3;
  ParseableFunctionInfo *pPVar4;
  
  this_00 = GetNestedFunc(this,index);
  if (this_00 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x7fe,"(currentNestedFunction)","currentNestedFunction");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((this_00->attributes & DeferredDeserialize) != None) {
    FunctionProxy::EnsureDeserialized((this_00->functionBodyImpl).ptr);
  }
  pPVar4 = FunctionInfo::GetParseableFunctionInfo(this_00);
  return pPVar4;
}

Assistant:

ParseableFunctionInfo* ParseableFunctionInfo::GetNestedFunctionForExecution(uint index)
    {
        FunctionInfo* currentNestedFunction = this->GetNestedFunc(index);
        Assert(currentNestedFunction);
        if (currentNestedFunction->IsDeferredDeserializeFunction())
        {
            currentNestedFunction->GetFunctionProxy()->EnsureDeserialized();
        }

        return currentNestedFunction->GetParseableFunctionInfo();
    }